

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texel_fetch_invalid_sample
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  bool bVar2;
  ContextType ctxType;
  char *__s;
  long lVar3;
  DataType dataType;
  long lVar4;
  DataType in_stack_fffffffffffffd18;
  allocator<char> local_2e1;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_290,(_anonymous_namespace_ *)0x2d,dataType);
    bVar2 = NegativeTestContext::isExtensionSupported(ctx,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    if (!bVar2) {
      return;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"texelFetch: Invalid sample type.",
             (allocator<char> *)&local_2b0);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,__s,&local_2e1);
      std::operator+(&shaderSource,"Verify shader: ",&local_2b0);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_2b0);
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
        DVar1 = *(DataType *)
                 ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar3);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x42,TYPE_INT_VEC2,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x43,TYPE_INT_VEC2,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x44,TYPE_INT_VEC2,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x58,TYPE_INT_VEC3,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x59,TYPE_INT_VEC3,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x5a,TYPE_INT_VEC3,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar3 != 0) {
          DVar1 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar3);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x42,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x43,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x44,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          std::__cxx11::string::string((string *)&local_150,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x58,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          std::__cxx11::string::string((string *)&local_170,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x59,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          std::__cxx11::string::string((string *)&local_190,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x5a,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          std::__cxx11::string::string((string *)&local_1b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        DVar1 = *(DataType *)
                 ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar3);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x42,TYPE_INT_VEC2,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_1d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x43,TYPE_INT_VEC2,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x44,TYPE_INT_VEC2,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_210,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x58,TYPE_INT_VEC3,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_230,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x59,TYPE_INT_VEC3,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_250,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x5a,TYPE_INT_VEC3,DVar1,
                   in_stack_fffffffffffffd18);
        std::__cxx11::string::string((string *)&local_270,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&shaderSource);
      }
      NegativeTestContext::endSection(ctx);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texel_fetch_invalid_sample (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("texelFetch: Invalid sample type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT)
					{
						// SAMPLER_2D_MULTISAMPLE
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}

						// SAMPLER_2D_MULTISAMPLE_ARRAY
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}

					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}